

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcRobustBufferAccessBehaviorTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::RobustBufferAccessBehavior::TexelFetchTest::iterate(TexelFetchTest *this)

{
  int iVar1;
  TEST_CASES TVar2;
  GLenum GVar3;
  GLenum GVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined8 in_RCX;
  char *description;
  GLint level;
  bool bVar6;
  allocator<char> local_39b;
  allocator<char> local_39a;
  allocator<char> local_399;
  GLenum local_398;
  uint local_394;
  Texture destination_texture;
  Texture source_texture;
  VertexArray vao;
  Framebuffer framebuffer;
  GLint max_image_samples;
  GLint max_integer_samples;
  string local_310;
  Program valid_program;
  Program invalid_program;
  string local_210;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [8];
  ostream local_1a8;
  Functions *gl;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar1);
  TVar2 = this->m_test_case;
  local_394 = (uint)CONCAT71((int7)((ulong)in_RCX >> 8),1);
  do {
    if (4 < (int)TVar2) {
      bVar6 = (local_394 & 1) == 0;
      if (bVar6) {
        description = "Fail";
      }
      else {
        description = "Pass";
      }
      tcu::TestContext::setTestResult
                (((this->super_TestCase).m_context)->m_testCtx,(uint)bVar6,description);
      return STOP;
    }
    if (TVar2 - RG8_SNORM < 2) {
      TVar2 = TVar2 + RG8_SNORM;
      this->m_test_case = TVar2;
    }
    else {
      destination_texture.m_context = (this->super_TestCase).m_context;
      destination_texture.m_id = 0xffffffff;
      framebuffer.m_id = 0xffffffff;
      invalid_program.m_id = 0;
      invalid_program.m_compute.m_id = 0;
      invalid_program.m_fragment.m_id = 0;
      invalid_program.m_geometry.m_id = 0;
      invalid_program.m_tess_ctrl.m_id = 0;
      invalid_program.m_tess_eval.m_id = 0;
      invalid_program.m_vertex.m_id = 0;
      source_texture.m_id = 0xffffffff;
      valid_program.m_id = 0;
      valid_program.m_compute.m_id = 0;
      valid_program.m_fragment.m_id = 0;
      valid_program.m_geometry.m_id = 0;
      valid_program.m_tess_ctrl.m_id = 0;
      valid_program.m_tess_eval.m_id = 0;
      valid_program.m_vertex.m_id = 0;
      vao.m_id = 0xffffffff;
      source_texture.m_context = destination_texture.m_context;
      vao.m_context = destination_texture.m_context;
      framebuffer.m_context = destination_texture.m_context;
      valid_program.m_compute.m_context = destination_texture.m_context;
      valid_program.m_fragment.m_context = destination_texture.m_context;
      valid_program.m_geometry.m_context = destination_texture.m_context;
      valid_program.m_tess_ctrl.m_context = destination_texture.m_context;
      valid_program.m_tess_eval.m_context = destination_texture.m_context;
      valid_program.m_vertex.m_context = destination_texture.m_context;
      valid_program.m_context = destination_texture.m_context;
      invalid_program.m_compute.m_context = destination_texture.m_context;
      invalid_program.m_fragment.m_context = destination_texture.m_context;
      invalid_program.m_geometry.m_context = destination_texture.m_context;
      invalid_program.m_tess_ctrl.m_context = destination_texture.m_context;
      invalid_program.m_tess_eval.m_context = destination_texture.m_context;
      invalid_program.m_vertex.m_context = destination_texture.m_context;
      invalid_program.m_context = destination_texture.m_context;
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])(&local_1f0,this,0);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])(&local_210,this,1);
      VertexArray::Generate(gl,&vao.m_id);
      VertexArray::Bind(gl,vao.m_id);
      RobustBufferAccessBehavior::Texture::Generate(gl,&destination_texture.m_id);
      RobustBufferAccessBehavior::Texture::Generate(gl,&source_texture.m_id);
      if (this->m_test_case == R32UI_MULTISAMPLE) {
        (*gl->getIntegerv)(0x9110,&max_integer_samples);
        (*gl->getIntegerv)(0x906d,&max_image_samples);
        if ((3 < max_integer_samples) && (3 < max_image_samples)) goto LAB_00d55738;
        local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::operator<<(&local_1a8,"Test case: ");
        iVar1 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])();
        std::operator<<(&local_1a8,(char *)CONCAT44(extraout_var_00,iVar1));
        std::operator<<(&local_1a8," not supported");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00d55d55:
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      }
      else {
LAB_00d55738:
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
                  (this,0,(ulong)destination_texture.m_id);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
                  (this,1,(ulong)source_texture.m_id);
        local_398 = 0xde1;
        if (this->m_test_case == R32UI_MIPMAP) {
          level = 1;
        }
        else {
          level = 0;
          if (this->m_test_case == R32UI_MULTISAMPLE) {
            local_398 = 0x9100;
          }
        }
        RobustBufferAccessBehavior::Framebuffer::Generate(gl,&framebuffer.m_id);
        RobustBufferAccessBehavior::Framebuffer::Bind(gl,0x8ca9,framebuffer.m_id);
        RobustBufferAccessBehavior::Framebuffer::AttachTexture
                  (gl,0x8ca9,0x8ce0,destination_texture.m_id,level,0x10,0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1b0,glcts::fixed_sample_locations_values + 1,&local_399);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[8])
                  (&max_integer_samples);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&max_image_samples,glcts::fixed_sample_locations_values + 1,&local_39a)
        ;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_310,glcts::fixed_sample_locations_values + 1,&local_39b);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[9])(&local_1d0);
        RobustBufferAccessBehavior::Program::Init
                  (&valid_program,(string *)local_1b0,&local_210,(string *)&max_integer_samples,
                   (string *)&max_image_samples,&local_310,&local_1d0);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_310);
        std::__cxx11::string::~string((string *)&max_image_samples);
        std::__cxx11::string::~string((string *)&max_integer_samples);
        std::__cxx11::string::~string((string *)local_1b0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1b0,glcts::fixed_sample_locations_values + 1,&local_399);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[8])
                  ((string *)&max_integer_samples);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&max_image_samples,glcts::fixed_sample_locations_values + 1,&local_39a)
        ;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_310,glcts::fixed_sample_locations_values + 1,&local_39b);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[9])(&local_1d0);
        RobustBufferAccessBehavior::Program::Init
                  (&invalid_program,(string *)local_1b0,&local_1f0,(string *)&max_integer_samples,
                   (string *)&max_image_samples,&local_310,&local_1d0);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_310);
        std::__cxx11::string::~string((string *)&max_image_samples);
        std::__cxx11::string::~string((string *)&max_integer_samples);
        std::__cxx11::string::~string((string *)local_1b0);
        RobustBufferAccessBehavior::Program::Use(gl,valid_program.m_id);
        (*gl->activeTexture)(0x84c0);
        GVar3 = (*gl->getError)();
        glu::checkError(GVar3,"ActiveTexture",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                        ,0x588);
        RobustBufferAccessBehavior::Texture::Bind(gl,source_texture.m_id,local_398);
        (*gl->uniform1i)(0,0);
        GVar3 = (*gl->getError)();
        glu::checkError(GVar3,"Uniform1i",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                        ,0x58b);
        GVar3 = (*gl->checkFramebufferStatus)(0x8ca9);
        GVar4 = (*gl->getError)();
        glu::checkError(GVar4,"CheckFramebufferStatus",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                        ,0x58f);
        if (GVar3 != 0x8cd5) {
          local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::operator<<(&local_1a8,"Test case: ");
          iVar1 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])();
          std::operator<<(&local_1a8,(char *)CONCAT44(extraout_var_02,iVar1));
          std::operator<<(&local_1a8," not supported");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          goto LAB_00d55d55;
        }
        if (this->m_test_case == R32UI_MULTISAMPLE) {
          (*gl->enable)(0x809d);
          GVar3 = (*gl->getError)();
          glu::checkError(GVar3,"Enable",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                          ,0x59c);
        }
        (*gl->drawArrays)(0,0,1);
        GVar3 = (*gl->getError)();
        if (this->m_test_case == R32UI_MULTISAMPLE) {
          (*gl->disable)(0x809d);
          GVar4 = (*gl->getError)();
          glu::checkError(GVar4,"Disable",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                          ,0x5a9);
        }
        glu::checkError(GVar3,"DrawArrays",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                        ,0x5ad);
        iVar1 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0xb])
                          (this,(ulong)destination_texture.m_id);
        RobustBufferAccessBehavior::Program::Use(gl,invalid_program.m_id);
        (*gl->activeTexture)(0x84c0);
        GVar3 = (*gl->getError)();
        glu::checkError(GVar3,"ActiveTexture",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                        ,0x5bc);
        RobustBufferAccessBehavior::Texture::Bind(gl,source_texture.m_id,local_398);
        (*gl->uniform1i)(0,0);
        GVar3 = (*gl->getError)();
        glu::checkError(GVar3,"Uniform1i",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                        ,0x5bf);
        (*gl->drawArrays)(0,0,1);
        GVar3 = (*gl->getError)();
        glu::checkError(GVar3,"DrawArrays",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                        ,0x5c8);
        iVar5 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[10])();
        if ((byte)((byte)iVar1 & (byte)iVar5) == 0) {
          local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::operator<<(&local_1a8,"Test case: ");
          iVar1 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])();
          std::operator<<(&local_1a8,(char *)CONCAT44(extraout_var_01,iVar1));
          std::operator<<(&local_1a8," failed");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
          local_394 = 0;
        }
      }
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_1f0);
      VertexArray::~VertexArray(&vao);
      RobustBufferAccessBehavior::Program::~Program(&valid_program);
      RobustBufferAccessBehavior::Texture::~Texture(&source_texture);
      RobustBufferAccessBehavior::Program::~Program(&invalid_program);
      RobustBufferAccessBehavior::Framebuffer::~Framebuffer(&framebuffer);
      RobustBufferAccessBehavior::Texture::~Texture(&destination_texture);
      TVar2 = this->m_test_case;
    }
    TVar2 = TVar2 + RG8_SNORM;
    this->m_test_case = TVar2;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult TexelFetchTest::iterate()
{
	/* Constants */
	static const GLuint height = 16;
	static const GLuint width  = 16;

	/* GL entry points */
	const Functions& gl = m_context.getRenderContext().getFunctions();

	/* Test result indicator */
	bool test_result = true;

	/* Iterate over all cases */
	for (; m_test_case < LAST; m_test_case = (TEST_CASES)((GLuint)m_test_case + 1))
	{
		bool   case_result	= true;
		GLint  level		  = 0;
		GLenum texture_target = GL_TEXTURE_2D;

		if (R32UI_MULTISAMPLE == m_test_case || RG8_SNORM == m_test_case)
		{
			// 1. RG8_SNORM case:
			// Skip RG8_SNORM format case.
			// RG8_SNORM is not required to be used as a render target
			// OpenGL 4.5 Core Spec, Page 197
			//
			// 2. R32UI_MULTISAMPLE case
			// Skip test in multi sample case
			// texelFetch with invalid lod plane results undefined value
			// OpenGL 4.5 Core Spec, around page 377
			m_test_case = (TEST_CASES)((GLuint)m_test_case + 1);
			continue;
		}

		/* */
		Texture		destination_texture(m_context);
		Framebuffer framebuffer(m_context);
		Program		invalid_program(m_context);
		Texture		source_texture(m_context);
		Program		valid_program(m_context);
		VertexArray vao(m_context);

		const std::string& fs_invalid = getFragmentShader(false);
		const std::string& fs_valid   = getFragmentShader(true);

		/* Prepare VAO */
		VertexArray::Generate(gl, vao.m_id);
		VertexArray::Bind(gl, vao.m_id);

		/* Prepare textures */
		Texture::Generate(gl, destination_texture.m_id);
		Texture::Generate(gl, source_texture.m_id);

		if (R32UI_MULTISAMPLE == m_test_case)
		{
			GLint max_integer_samples;
			gl.getIntegerv(GL_MAX_INTEGER_SAMPLES, &max_integer_samples);
			GLint max_image_samples;
			gl.getIntegerv(GL_MAX_IMAGE_SAMPLES, &max_image_samples);
			if (max_integer_samples < 4 || max_image_samples < 4)
			{
				/* prepareTexture() hard-codes 4 samples (n_levels) for
				 * R32UI_MULTISAMPLE case. This value exceeds the required
				 * min-max value (1 in OpenGL ES 3.2) and is not supported
				 * by all implementations.
				 *
				 * Also, the test uses a compute shader with images
				 * to upload the texture so max_image_samples >= 4
				 * is also required.
				 */
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "Test case: " << getTestCaseName()
													<< " not supported" << tcu::TestLog::EndMessage;

				continue;
			}
		}

		prepareTexture(false, destination_texture.m_id);
		prepareTexture(true, source_texture.m_id);

		/* Select FBO settings */
		if (R32UI_MIPMAP == m_test_case)
		{
			level = 1;
		}
		else if (R32UI_MULTISAMPLE == m_test_case)
		{
			texture_target = GL_TEXTURE_2D_MULTISAMPLE;
		}

		/* Prepare FBO */
		Framebuffer::Generate(gl, framebuffer.m_id);
		Framebuffer::Bind(gl, GL_DRAW_FRAMEBUFFER, framebuffer.m_id);
		Framebuffer::AttachTexture(gl, GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, destination_texture.m_id, level,
								   width, height);

		/* Prepare programs */
		valid_program.Init("" /* cs */, fs_valid, getGeometryShader(), "" /* tcs */, "" /* tes */, getVertexShader());
		invalid_program.Init("" /* cs */, fs_invalid, getGeometryShader(), "" /* tcs */, "" /* tes */,
							 getVertexShader());

		/* Test valid case */
		/* Set program */
		Program::Use(gl, valid_program.m_id);

		/* Set texture */
		gl.activeTexture(GL_TEXTURE0); /* location = 0 */
		GLU_EXPECT_NO_ERROR(gl.getError(), "ActiveTexture");
		Texture::Bind(gl, source_texture.m_id, texture_target);
		gl.uniform1i(0 /* location */, 0 /* texture unit */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform1i");

		/* Check if setup is supported */
		GLenum fbo_status = gl.checkFramebufferStatus(GL_DRAW_FRAMEBUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "CheckFramebufferStatus");
		if (GL_FRAMEBUFFER_COMPLETE != fbo_status)
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Test case: " << getTestCaseName()
												<< " not supported" << tcu::TestLog::EndMessage;

			continue;
		}

		/* Enable multisampling */
		if (R32UI_MULTISAMPLE == m_test_case)
		{
			gl.enable(GL_MULTISAMPLE);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Enable");
		}

		/* Draw */
		gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
		{
			/* Get error from draw */
			GLenum error = gl.getError();

			/* Disable multisampling */
			if (R32UI_MULTISAMPLE == m_test_case)
			{
				gl.disable(GL_MULTISAMPLE);
				GLU_EXPECT_NO_ERROR(gl.getError(), "Disable");
			}

			/* Handle error from draw */
			GLU_EXPECT_NO_ERROR(error, "DrawArrays");
		}

		/* Verification */
		if (false == verifyValidResults(destination_texture.m_id))
		{
			case_result = false;
		}

		/* Test invalid case */
		/* Set program */
		Program::Use(gl, invalid_program.m_id);

		/* Set texture */
		gl.activeTexture(GL_TEXTURE0); /* location = 0 */
		GLU_EXPECT_NO_ERROR(gl.getError(), "ActiveTexture");
		Texture::Bind(gl, source_texture.m_id, texture_target);
		gl.uniform1i(0 /* location */, 0 /* texture unit */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform1i");

		/* Draw */
		gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
		{
			/* Get error from draw */
			GLenum error = gl.getError();

			/* Handle error from draw */
			GLU_EXPECT_NO_ERROR(error, "DrawArrays");
		}

		/* Verification */
		if (false == verifyInvalidResults(destination_texture.m_id))
		{
			case_result = false;
		}

		/* Set test result */
		if (false == case_result)
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Test case: " << getTestCaseName()
												<< " failed" << tcu::TestLog::EndMessage;

			test_result = false;
		}
	}

	/* Set result */
	if (true == test_result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}